

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_skey.cc
# Opt level: O3

ASN1_OCTET_STRING * s2i_ASN1_OCTET_STRING(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,char *str)

{
  ulong in_RAX;
  uchar *data;
  ASN1_OCTET_STRING *str_00;
  size_t len;
  ulong local_18;
  
  local_18 = in_RAX;
  data = x509v3_hex_to_bytes(str,&local_18);
  if (data != (uchar *)0x0) {
    if (local_18 >> 0x1f == 0) {
      str_00 = ASN1_OCTET_STRING_new();
      if (str_00 != (ASN1_OCTET_STRING *)0x0) {
        ASN1_STRING_set0(str_00,data,(int)local_18);
        return str_00;
      }
    }
    else {
      ERR_put_error(0x14,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_skey.cc"
                    ,0x2c);
    }
    OPENSSL_free(data);
  }
  return (ASN1_OCTET_STRING *)0x0;
}

Assistant:

ASN1_OCTET_STRING *s2i_ASN1_OCTET_STRING(const X509V3_EXT_METHOD *method,
                                         const X509V3_CTX *ctx,
                                         const char *str) {
  size_t len;
  uint8_t *data = x509v3_hex_to_bytes(str, &len);
  ASN1_OCTET_STRING *oct;
  if (data == NULL) {
    return NULL;
  }
  if (len > INT_MAX) {
    OPENSSL_PUT_ERROR(X509V3, ERR_R_OVERFLOW);
    goto err;
  }

  oct = ASN1_OCTET_STRING_new();
  if (oct == NULL) {
    goto err;
  }
  ASN1_STRING_set0(oct, data, (int)len);
  return oct;

err:
  OPENSSL_free(data);
  return NULL;
}